

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O3

string * __thiscall
GeneratorExpressionContent::ProcessArbitraryContent
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,const_iterator pit)

{
  pointer ppcVar1;
  cmGeneratorExpressionEvaluator *pcVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  pointer ppcVar6;
  string *psVar7;
  string result;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string *local_98;
  GeneratorExpressionContent *local_90;
  cmGeneratorExpressionDAGChecker *local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8._M_allocated_capacity = (size_type)&local_a8;
  local_b8._8_8_ = 0;
  local_a8._M_local_buf[0] = '\0';
  local_78 = (this->ParamChildren).
             super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = __return_storage_ptr__;
  local_90 = this;
  local_88 = dagChecker;
  local_80 = identifier;
  if (local_78 != pit._M_current) {
    while( true ) {
      ppcVar1 = ((pit._M_current)->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar6 = ((pit._M_current)->
                     super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
          ppcVar6 = ppcVar6 + 1) {
        pcVar2 = *ppcVar6;
        iVar3 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
        if (((char)iVar3 != '\0') &&
           (iVar3 = (*pcVar2->_vptr_cmGeneratorExpressionEvaluator[2])(pcVar2), iVar3 != 0)) {
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,local_90->StartContent,
                     local_90->StartContent + local_90->ContentLength);
          std::operator+(&local_50,"$<",local_80);
          psVar7 = local_98;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar5 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_70.field_2._M_allocated_capacity = *psVar5;
            local_70.field_2._8_8_ = plVar4[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar5;
            local_70._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_70._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          reportError(context,(string *)local_d8,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
          psVar7->_M_string_length = 0;
          (psVar7->field_2)._M_local_buf[0] = '\0';
          goto LAB_003aa9ca;
        }
        (*pcVar2->_vptr_cmGeneratorExpressionEvaluator[3])(local_d8,pcVar2,context,local_88);
        std::__cxx11::string::_M_append(local_b8._M_local_buf,local_d8._0_8_);
        if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if (context->HadError == true) {
          (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
          local_98->_M_string_length = 0;
          (local_98->field_2)._M_local_buf[0] = '\0';
          psVar7 = local_98;
          goto LAB_003aa9ca;
        }
      }
      pit._M_current = pit._M_current + 1;
      if (pit._M_current == local_78) break;
      std::__cxx11::string::append(local_b8._M_local_buf);
    }
  }
  iVar3 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
  psVar7 = local_98;
  if ((char)iVar3 == '\0') {
    (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity == &local_a8) {
      (local_98->field_2)._M_allocated_capacity =
           CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]);
      *(undefined8 *)((long)&local_98->field_2 + 8) = local_a8._8_8_;
    }
    else {
      (local_98->_M_dataplus)._M_p = (pointer)local_b8._M_allocated_capacity;
      (local_98->field_2)._M_allocated_capacity =
           CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]);
    }
    local_98->_M_string_length = local_b8._8_8_;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_b8._M_allocated_capacity = (size_type)&local_a8;
  }
  else {
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8,(value_type *)&local_b8);
    (*node->_vptr_cmGeneratorExpressionNode[6])(psVar7,node,local_d8,context,local_90,local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  }
LAB_003aa9ca:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    operator_delete((void *)local_b8._M_allocated_capacity,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  return psVar7;
}

Assistant:

std::string GeneratorExpressionContent::ProcessArbitraryContent(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator
    pit) const
{
  std::string result;

  const std::vector<
    std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator pend =
    this->ParamChildren.end();
  for (; pit != pend; ++pit) {
    for (cmGeneratorExpressionEvaluator* pExprEval : *pit) {
      if (node->RequiresLiteralInput()) {
        if (pExprEval->GetType() != cmGeneratorExpressionEvaluator::Text) {
          reportError(context, this->GetOriginalExpression(),
                      "$<" + identifier +
                        "> expression requires literal input.");
          return std::string();
        }
      }
      result += pExprEval->Evaluate(context, dagChecker);
      if (context->HadError) {
        return std::string();
      }
    }
    if ((pit + 1) != pend) {
      result += ",";
    }
  }
  if (node->RequiresLiteralInput()) {
    std::vector<std::string> parameters;
    parameters.push_back(result);
    return node->Evaluate(parameters, context, this, dagChecker);
  }
  return result;
}